

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariables.cpp
# Opt level: O2

ChVariables * __thiscall chrono::ChVariables::operator=(ChVariables *this,ChVariables *other)

{
  if (other != this) {
    this->disabled = other->disabled;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&this->qb,&other->qb);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&this->fb,&other->fb);
    this->ndof = other->ndof;
    this->offset = other->offset;
  }
  return this;
}

Assistant:

ChVariables& ChVariables::operator=(const ChVariables& other) {
    if (&other == this)
        return *this;

    this->disabled = other.disabled;

    this->qb = other.qb;
    this->fb = other.fb;

    this->ndof = other.ndof;
    this->offset = other.offset;

    return *this;
}